

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O1

ostream * Gs::operator<<(ostream *stream,Matrix<float,_2UL,_2UL> *mat)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 uVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  bool bVar9;
  size_t lengths [2];
  float *local_70;
  char *local_68;
  long local_60;
  char local_58 [16];
  ulong auStack_48 [3];
  
  pfVar7 = mat->m_;
  lVar8 = 0;
  do {
    auStack_48[lVar8] = 0;
    lVar6 = 0;
    do {
      sVar4 = Details::Length<float>((float *)((long)pfVar7 + lVar6));
      if (sVar4 < auStack_48[lVar8]) {
        sVar4 = auStack_48[lVar8];
      }
      auStack_48[lVar8] = sVar4;
      lVar6 = lVar6 + 4;
    } while (lVar6 == 4);
    pfVar7 = pfVar7 + 2;
    bVar9 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar9);
  auStack_48[2] = 0;
  local_70 = mat->m_;
  do {
    uVar3 = 0x5c;
    if (auStack_48[2] == 0) {
      uVar3 = 0x2f;
    }
    local_68._0_1_ = uVar3;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_68,1);
    lVar8 = 0;
    do {
      uVar1 = *(undefined8 *)((long)auStack_48 + lVar8);
      sVar4 = Details::Length<float>((float *)((long)local_70 + lVar8));
      local_68 = local_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,((char)uVar1 - (char)sVar4) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_68,local_60);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      poVar5 = std::ostream::_M_insert<double>((double)*(float *)((long)local_70 + lVar8));
      local_68._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_68,1);
      uVar2 = auStack_48[2];
      lVar8 = lVar8 + 8;
    } while (lVar8 == 8);
    uVar3 = 0x2f;
    if (auStack_48[2] == 0) {
      uVar3 = 0x5c;
    }
    local_68 = (char *)CONCAT71(local_68._1_7_,uVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_68,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    auStack_48[2] = uVar2 + 1;
    local_70 = local_70 + 1;
  } while (uVar2 == 0);
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}